

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesCommon
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props)

{
  PropertyTable *pPVar1;
  float fVar2;
  allocator<char> local_2f9;
  string local_2f8;
  float local_2d8;
  allocator<char> local_2d1;
  float DispFactor;
  float local_2b0;
  allocator<char> local_2a9;
  float BumpFactor;
  float local_288;
  allocator<char> local_281;
  float ReflectionFactor;
  undefined1 local_25c [20];
  aiColor3D *Reflection;
  string local_240;
  float local_220;
  allocator<char> local_219;
  float Opacity;
  float local_1f4;
  float local_1f0;
  float TransparencyFactor;
  float CalculatedOpacity;
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_19c [20];
  aiColor3D *Transparent;
  string local_180;
  float local_160;
  allocator<char> local_159;
  float ShininessExponent;
  float local_138;
  allocator<char> local_131;
  float SpecularFactor;
  undefined1 local_10c [20];
  aiColor3D *Specular;
  string local_f0 [36];
  undefined1 local_cc [20];
  aiColor3D *Ambient;
  string local_b0 [36];
  undefined1 local_8c [20];
  aiColor3D *Emissive;
  string local_60 [36];
  undefined1 local_3c [20];
  aiColor3D *Diffuse;
  PropertyTable *pPStack_20;
  bool ok;
  PropertyTable *props_local;
  aiMaterial *out_mat_local;
  FBXConverter *this_local;
  
  pPStack_20 = props;
  props_local = (PropertyTable *)out_mat;
  out_mat_local = (aiMaterial *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"Diffuse",(allocator<char> *)&stack0xffffffffffffff9f);
  GetColorPropertyFromMaterial
            ((FBXConverter *)local_3c,(PropertyTable *)this,(string *)props,(bool *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  local_3c._12_8_ = local_3c;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty
              ((aiMaterial *)props_local,(aiColor3D *)local_3c._12_8_,1,"$clr.diffuse",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"Emissive",(allocator<char> *)((long)&Ambient + 7));
  GetColorPropertyFromMaterial
            ((FBXConverter *)local_8c,(PropertyTable *)this,(string *)pPVar1,(bool *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Ambient + 7));
  local_8c._12_8_ = local_8c;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty
              ((aiMaterial *)props_local,(aiColor3D *)local_8c._12_8_,1,"$clr.emissive",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"Ambient",(allocator<char> *)((long)&Specular + 7));
  GetColorPropertyFromMaterial
            ((FBXConverter *)local_cc,(PropertyTable *)this,(string *)pPVar1,(bool *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Specular + 7));
  local_cc._12_8_ = local_cc;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty
              ((aiMaterial *)props_local,(aiColor3D *)local_cc._12_8_,1,"$clr.ambient",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SpecularFactor,"SpecularColor",&local_131);
  GetColorProperty((FBXConverter *)local_10c,(PropertyTable *)this,(string *)pPVar1,
                   (bool *)&SpecularFactor,(bool)((char)&Diffuse + '\a'));
  std::__cxx11::string::~string((string *)&SpecularFactor);
  std::allocator<char>::~allocator(&local_131);
  local_10c._12_8_ = local_10c;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty
              ((aiMaterial *)props_local,(aiColor3D *)local_10c._12_8_,1,"$clr.specular",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ShininessExponent,"SpecularFactor",&local_159);
  fVar2 = PropertyGet<float>(pPVar1,(string *)&ShininessExponent,(bool *)((long)&Diffuse + 7),true);
  std::__cxx11::string::~string((string *)&ShininessExponent);
  std::allocator<char>::~allocator(&local_159);
  local_138 = fVar2;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty((aiMaterial *)props_local,&local_138,1,"$mat.shinpercent",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"ShininessExponent",(allocator<char> *)((long)&Transparent + 7));
  fVar2 = PropertyGet<float>(pPVar1,&local_180,(bool *)((long)&Diffuse + 7),false);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Transparent + 7));
  local_160 = fVar2;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty((aiMaterial *)props_local,&local_160,1,"$mat.shininess",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"TransparentColor",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&CalculatedOpacity,"TransparencyFactor",
             (allocator<char> *)((long)&TransparencyFactor + 3));
  GetColorPropertyFactored
            ((FBXConverter *)local_19c,(PropertyTable *)this,(string *)pPVar1,&local_1c0,
             (bool *)&CalculatedOpacity,(bool)((char)&Diffuse + '\a'));
  std::__cxx11::string::~string((string *)&CalculatedOpacity);
  std::allocator<char>::~allocator((allocator<char> *)((long)&TransparencyFactor + 3));
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  local_19c._12_8_ = local_19c;
  local_1f0 = 1.0;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty
              ((aiMaterial *)props_local,(aiColor3D *)local_19c._12_8_,1,"$clr.transparent",0,0);
    local_1f0 = 1.0 - (*(ai_real *)local_19c._12_8_ + *(ai_real *)(local_19c._12_8_ + 4) +
                      *(ai_real *)(local_19c._12_8_ + 8)) / 3.0;
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Opacity,"TransparencyFactor",&local_219);
  fVar2 = PropertyGet<float>(pPVar1,(string *)&Opacity,(bool *)((long)&Diffuse + 7),false);
  std::__cxx11::string::~string((string *)&Opacity);
  std::allocator<char>::~allocator(&local_219);
  local_1f4 = fVar2;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty((aiMaterial *)props_local,&local_1f4,1,"$mat.transparencyfactor",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Opacity",(allocator<char> *)((long)&Reflection + 7));
  fVar2 = PropertyGet<float>(pPVar1,&local_240,(bool *)((long)&Diffuse + 7),false);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Reflection + 7));
  local_220 = fVar2;
  if ((Diffuse._7_1_ & 1) == 0) {
    if ((local_1f0 != 1.0) || (NAN(local_1f0))) {
      aiMaterial::AddProperty((aiMaterial *)props_local,&local_1f0,1,"$mat.opacity",0,0);
    }
  }
  else {
    aiMaterial::AddProperty((aiMaterial *)props_local,&local_220,1,"$mat.opacity",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ReflectionFactor,"ReflectionColor",&local_281);
  GetColorProperty((FBXConverter *)local_25c,(PropertyTable *)this,(string *)pPVar1,
                   (bool *)&ReflectionFactor,(bool)((char)&Diffuse + '\a'));
  std::__cxx11::string::~string((string *)&ReflectionFactor);
  std::allocator<char>::~allocator(&local_281);
  local_25c._12_8_ = local_25c;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty
              ((aiMaterial *)props_local,(aiColor3D *)local_25c._12_8_,1,"$clr.reflective",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&BumpFactor,"ReflectionFactor",&local_2a9);
  fVar2 = PropertyGet<float>(pPVar1,(string *)&BumpFactor,(bool *)((long)&Diffuse + 7),true);
  std::__cxx11::string::~string((string *)&BumpFactor);
  std::allocator<char>::~allocator(&local_2a9);
  local_288 = fVar2;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty((aiMaterial *)props_local,&local_288,1,"$mat.reflectivity",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&DispFactor,"BumpFactor",&local_2d1);
  fVar2 = PropertyGet<float>(pPVar1,(string *)&DispFactor,(bool *)((long)&Diffuse + 7),false);
  std::__cxx11::string::~string((string *)&DispFactor);
  std::allocator<char>::~allocator(&local_2d1);
  local_2b0 = fVar2;
  if ((Diffuse._7_1_ & 1) != 0) {
    aiMaterial::AddProperty((aiMaterial *)props_local,&local_2b0,1,"$mat.bumpscaling",0,0);
  }
  pPVar1 = pPStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"DisplacementFactor",&local_2f9);
  fVar2 = PropertyGet<float>(pPVar1,&local_2f8,(bool *)((long)&Diffuse + 7),false);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  if ((Diffuse._7_1_ & 1) != 0) {
    local_2d8 = fVar2;
    aiMaterial::AddProperty((aiMaterial *)props_local,&local_2d8,1,"$mat.displacementscaling",0,0);
  }
  return;
}

Assistant:

void FBXConverter::SetShadingPropertiesCommon(aiMaterial* out_mat, const PropertyTable& props)
        {
            // Set shading properties.
            // Modern FBX Files have two separate systems for defining these,
            // with only the more comprehensive one described in the property template.
            // Likely the other values are a legacy system,
            // which is still always exported by the official FBX SDK.
            //
            // Blender's FBX import and export mostly ignore this legacy system,
            // and as we only support recent versions of FBX anyway, we can do the same.
            bool ok;

            const aiColor3D& Diffuse = GetColorPropertyFromMaterial(props, "Diffuse", ok);
            if (ok) {
                out_mat->AddProperty(&Diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
            }

            const aiColor3D& Emissive = GetColorPropertyFromMaterial(props, "Emissive", ok);
            if (ok) {
                out_mat->AddProperty(&Emissive, 1, AI_MATKEY_COLOR_EMISSIVE);
            }

            const aiColor3D& Ambient = GetColorPropertyFromMaterial(props, "Ambient", ok);
            if (ok) {
                out_mat->AddProperty(&Ambient, 1, AI_MATKEY_COLOR_AMBIENT);
            }

            // we store specular factor as SHININESS_STRENGTH, so just get the color
            const aiColor3D& Specular = GetColorProperty(props, "SpecularColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Specular, 1, AI_MATKEY_COLOR_SPECULAR);
            }

            // and also try to get SHININESS_STRENGTH
            const float SpecularFactor = PropertyGet<float>(props, "SpecularFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&SpecularFactor, 1, AI_MATKEY_SHININESS_STRENGTH);
            }

            // and the specular exponent
            const float ShininessExponent = PropertyGet<float>(props, "ShininessExponent", ok);
            if (ok) {
                out_mat->AddProperty(&ShininessExponent, 1, AI_MATKEY_SHININESS);
            }

            // TransparentColor / TransparencyFactor... gee thanks FBX :rolleyes:
            const aiColor3D& Transparent = GetColorPropertyFactored(props, "TransparentColor", "TransparencyFactor", ok);
            float CalculatedOpacity = 1.0f;
            if (ok) {
                out_mat->AddProperty(&Transparent, 1, AI_MATKEY_COLOR_TRANSPARENT);
                // as calculated by FBX SDK 2017:
                CalculatedOpacity = 1.0f - ((Transparent.r + Transparent.g + Transparent.b) / 3.0f);
            }

            // try to get the transparency factor
            const float TransparencyFactor = PropertyGet<float>(props, "TransparencyFactor", ok);
            if (ok) {
                out_mat->AddProperty(&TransparencyFactor, 1, AI_MATKEY_TRANSPARENCYFACTOR);
            }

            // use of TransparencyFactor is inconsistent.
            // Maya always stores it as 1.0,
            // so we can't use it to set AI_MATKEY_OPACITY.
            // Blender is more sensible and stores it as the alpha value.
            // However both the FBX SDK and Blender always write an additional
            // legacy "Opacity" field, so we can try to use that.
            //
            // If we can't find it,
            // we can fall back to the value which the FBX SDK calculates
            // from transparency colour (RGB) and factor (F) as
            // 1.0 - F*((R+G+B)/3).
            //
            // There's no consistent way to interpret this opacity value,
            // so it's up to clients to do the correct thing.
            const float Opacity = PropertyGet<float>(props, "Opacity", ok);
            if (ok) {
                out_mat->AddProperty(&Opacity, 1, AI_MATKEY_OPACITY);
            }
            else if (CalculatedOpacity != 1.0) {
                out_mat->AddProperty(&CalculatedOpacity, 1, AI_MATKEY_OPACITY);
            }

            // reflection color and factor are stored separately
            const aiColor3D& Reflection = GetColorProperty(props, "ReflectionColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Reflection, 1, AI_MATKEY_COLOR_REFLECTIVE);
            }

            float ReflectionFactor = PropertyGet<float>(props, "ReflectionFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&ReflectionFactor, 1, AI_MATKEY_REFLECTIVITY);
            }

            const float BumpFactor = PropertyGet<float>(props, "BumpFactor", ok);
            if (ok) {
                out_mat->AddProperty(&BumpFactor, 1, AI_MATKEY_BUMPSCALING);
            }

            const float DispFactor = PropertyGet<float>(props, "DisplacementFactor", ok);
            if (ok) {
                out_mat->AddProperty(&DispFactor, 1, "$mat.displacementscaling", 0, 0);
    }
}